

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void renameTableFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  sqlite3_xauth p_Var1;
  ulong uVar2;
  Index *pTrigger_00;
  int iVar3;
  sqlite3 *db_00;
  uchar *zSql;
  uchar *zName;
  uchar *zNew_00;
  Table *pTVar4;
  uchar *local_2b8;
  u8 *local_2b0;
  TriggerStep *pStep;
  Trigger *pTrigger;
  FKey *pFKey;
  NameContext sNC;
  Table *pTab;
  int isLegacy;
  sqlite3_xauth xAuth;
  Walker sWalker;
  RenameCtx sCtx;
  int bQuote;
  int rc;
  Parse sParse;
  int bTemp;
  char *zNew;
  char *zOld;
  char *zInput;
  char *zDb;
  sqlite3 *db;
  sqlite3_value **argv_local;
  int NotUsed_local;
  sqlite3_context *context_local;
  
  db_00 = sqlite3_context_db_handle(context);
  local_2b8 = sqlite3_value_text(*argv);
  zSql = sqlite3_value_text(argv[3]);
  zName = sqlite3_value_text(argv[4]);
  zNew_00 = sqlite3_value_text(argv[5]);
  sParse.pRename._4_4_ = sqlite3_value_int(argv[6]);
  if (((zSql != (uchar *)0x0) && (zName != (uchar *)0x0)) && (zNew_00 != (uchar *)0x0)) {
    p_Var1 = db_00->xAuth;
    db_00->xAuth = (sqlite3_xauth)0x0;
    sqlite3BtreeEnterAll(db_00);
    memset(&sWalker.u,0,0x20);
    pTVar4 = sqlite3FindTable(db_00,(char *)zName,(char *)local_2b8);
    memset(&xAuth,0,0x30);
    xAuth = (sqlite3_xauth)&bQuote;
    sWalker.pParse = (Parse *)renameTableExprCb;
    sWalker.xExprCallback = renameTableSelectCb;
    sWalker._32_8_ = &sWalker.u;
    sCtx.zOld._4_4_ =
         renameParseSql((Parse *)&bQuote,(char *)local_2b8,1,db_00,(char *)zSql,sParse.pRename._4_4_
                       );
    pTrigger_00 = sParse.pNewIndex;
    if (sCtx.zOld._4_4_ == 0) {
      uVar2 = db_00->flags;
      if (sParse.zTail == (char *)0x0) {
        if (sParse.pNewTable == (Table *)0x0) {
          iVar3 = sqlite3_stricmp((char *)(sParse.pNewIndex)->aiColumn,(char *)zName);
          if ((iVar3 == 0) && (pTVar4->pSchema == pTrigger_00->pSchema)) {
            renameTokenFind((Parse *)&bQuote,(RenameCtx *)&sWalker.u,(sParse.pNewIndex)->aiColumn);
          }
          if ((uVar2 & 0x4000000) == 0) {
            if (sParse.pRename._4_4_ != 0) {
              local_2b8 = (uchar *)0x0;
            }
            sCtx.zOld._4_4_ = renameResolveTrigger((Parse *)&bQuote,(char *)local_2b8);
            if (sCtx.zOld._4_4_ == 0) {
              renameWalkTrigger((Walker *)&xAuth,(Trigger *)pTrigger_00);
              for (local_2b0 = pTrigger_00->aSortOrder; local_2b0 != (u8 *)0x0;
                  local_2b0 = *(u8 **)(local_2b0 + 0x48)) {
                if ((*(long *)(local_2b0 + 0x18) != 0) &&
                   (iVar3 = sqlite3_stricmp(*(char **)(local_2b0 + 0x18),(char *)zName), iVar3 == 0)
                   ) {
                  renameTokenFind((Parse *)&bQuote,(RenameCtx *)&sWalker.u,
                                  *(void **)(local_2b0 + 0x18));
                }
              }
            }
          }
        }
        else {
          renameTokenFind((Parse *)&bQuote,(RenameCtx *)&sWalker.u,(sParse.pNewTable)->zName);
          if ((uVar2 & 0x4000000) == 0) {
            sqlite3WalkExpr((Walker *)&xAuth,*(Expr **)&(sParse.pNewTable)->nRowLogEst);
          }
        }
      }
      else {
        sNC.pWinSelect = (Select *)sParse.zTail;
        if (*(long *)(sParse.zTail + 0x18) == 0) {
          if (((uVar2 & 0x4000000) == 0) || ((db_00->flags & 0x4000) != 0)) {
            for (pTrigger = *(Trigger **)(sParse.zTail + 0x20); pTrigger != (Trigger *)0x0;
                pTrigger = (Trigger *)pTrigger->table) {
              iVar3 = sqlite3_stricmp(*(char **)&pTrigger->op,(char *)zName);
              if (iVar3 == 0) {
                renameTokenFind((Parse *)&bQuote,(RenameCtx *)&sWalker.u,*(void **)&pTrigger->op);
              }
            }
          }
          iVar3 = sqlite3_stricmp((char *)zName,(char *)(sNC.pWinSelect)->pEList);
          if (iVar3 == 0) {
            if ((uVar2 & 0x4000000) == 0) {
              sqlite3WalkExprList((Walker *)&xAuth,(ExprList *)(sNC.pWinSelect)->pWhere);
            }
            renameTokenFind((Parse *)&bQuote,(RenameCtx *)&sWalker.u,(sNC.pWinSelect)->pEList);
          }
        }
        else if ((uVar2 & 0x4000000) == 0) {
          memset(&pFKey,0,0x38);
          pFKey = (FKey *)&bQuote;
          sqlite3SelectPrep((Parse *)&bQuote,*(Select **)&(sNC.pWinSelect)->selId,
                            (NameContext *)&pFKey);
          if (sParse.nRangeReg != 0) {
            sCtx.zOld._4_4_ = (int)sParse.pVdbe;
          }
          sqlite3WalkSelect((Walker *)&xAuth,*(Select **)&(sNC.pWinSelect)->selId);
        }
      }
    }
    if (sCtx.zOld._4_4_ == 0) {
      sCtx.zOld._4_4_ =
           renameEditSql(context,(RenameCtx *)&sWalker.u,(char *)zSql,(char *)zNew_00,1);
    }
    if (sCtx.zOld._4_4_ != 0) {
      if (sParse.db == (sqlite3 *)0x0) {
        sqlite3_result_error_code(context,sCtx.zOld._4_4_);
      }
      else {
        renameColumnParseError(context,0,argv[1],argv[2],(Parse *)&bQuote);
      }
    }
    renameParseCleanup((Parse *)&bQuote);
    renameTokenFree(db_00,(RenameToken *)sWalker.u.pNC);
    sqlite3BtreeLeaveAll(db_00);
    db_00->xAuth = p_Var1;
  }
  return;
}

Assistant:

static void renameTableFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  const char *zDb = (const char*)sqlite3_value_text(argv[0]);
  const char *zInput = (const char*)sqlite3_value_text(argv[3]);
  const char *zOld = (const char*)sqlite3_value_text(argv[4]);
  const char *zNew = (const char*)sqlite3_value_text(argv[5]);
  int bTemp = sqlite3_value_int(argv[6]);
  UNUSED_PARAMETER(NotUsed);

  if( zInput && zOld && zNew ){
    Parse sParse;
    int rc;
    int bQuote = 1;
    RenameCtx sCtx;
    Walker sWalker;

#ifndef SQLITE_OMIT_AUTHORIZATION
    sqlite3_xauth xAuth = db->xAuth;
    db->xAuth = 0;
#endif

    sqlite3BtreeEnterAll(db);

    memset(&sCtx, 0, sizeof(RenameCtx));
    sCtx.pTab = sqlite3FindTable(db, zOld, zDb);
    memset(&sWalker, 0, sizeof(Walker));
    sWalker.pParse = &sParse;
    sWalker.xExprCallback = renameTableExprCb;
    sWalker.xSelectCallback = renameTableSelectCb;
    sWalker.u.pRename = &sCtx;

    rc = renameParseSql(&sParse, zDb, 1, db, zInput, bTemp);

    if( rc==SQLITE_OK ){
      int isLegacy = (db->flags & SQLITE_LegacyAlter);
      if( sParse.pNewTable ){
        Table *pTab = sParse.pNewTable;

        if( pTab->pSelect ){
          if( isLegacy==0 ){
            NameContext sNC;
            memset(&sNC, 0, sizeof(sNC));
            sNC.pParse = &sParse;

            sqlite3SelectPrep(&sParse, pTab->pSelect, &sNC);
            if( sParse.nErr ) rc = sParse.rc;
            sqlite3WalkSelect(&sWalker, pTab->pSelect);
          }
        }else{
          /* Modify any FK definitions to point to the new table. */
#ifndef SQLITE_OMIT_FOREIGN_KEY
          if( isLegacy==0 || (db->flags & SQLITE_ForeignKeys) ){
            FKey *pFKey;
            for(pFKey=pTab->pFKey; pFKey; pFKey=pFKey->pNextFrom){
              if( sqlite3_stricmp(pFKey->zTo, zOld)==0 ){
                renameTokenFind(&sParse, &sCtx, (void*)pFKey->zTo);
              }
            }
          }
#endif

          /* If this is the table being altered, fix any table refs in CHECK
          ** expressions. Also update the name that appears right after the
          ** "CREATE [VIRTUAL] TABLE" bit. */
          if( sqlite3_stricmp(zOld, pTab->zName)==0 ){
            sCtx.pTab = pTab;
            if( isLegacy==0 ){
              sqlite3WalkExprList(&sWalker, pTab->pCheck);
            }
            renameTokenFind(&sParse, &sCtx, pTab->zName);
          }
        }
      }

      else if( sParse.pNewIndex ){
        renameTokenFind(&sParse, &sCtx, sParse.pNewIndex->zName);
        if( isLegacy==0 ){
          sqlite3WalkExpr(&sWalker, sParse.pNewIndex->pPartIdxWhere);
        }
      }

#ifndef SQLITE_OMIT_TRIGGER
      else{
        Trigger *pTrigger = sParse.pNewTrigger;
        TriggerStep *pStep;
        if( 0==sqlite3_stricmp(sParse.pNewTrigger->table, zOld) 
            && sCtx.pTab->pSchema==pTrigger->pTabSchema
          ){
          renameTokenFind(&sParse, &sCtx, sParse.pNewTrigger->table);
        }

        if( isLegacy==0 ){
          rc = renameResolveTrigger(&sParse, bTemp ? 0 : zDb);
          if( rc==SQLITE_OK ){
            renameWalkTrigger(&sWalker, pTrigger);
            for(pStep=pTrigger->step_list; pStep; pStep=pStep->pNext){
              if( pStep->zTarget && 0==sqlite3_stricmp(pStep->zTarget, zOld) ){
                renameTokenFind(&sParse, &sCtx, pStep->zTarget);
              }
            }
          }
        }
      }
#endif
    }

    if( rc==SQLITE_OK ){
      rc = renameEditSql(context, &sCtx, zInput, zNew, bQuote);
    }
    if( rc!=SQLITE_OK ){
      if( sParse.zErrMsg ){
        renameColumnParseError(context, 0, argv[1], argv[2], &sParse);
      }else{
        sqlite3_result_error_code(context, rc);
      }
    }

    renameParseCleanup(&sParse);
    renameTokenFree(db, sCtx.pList);
    sqlite3BtreeLeaveAll(db);
#ifndef SQLITE_OMIT_AUTHORIZATION
    db->xAuth = xAuth;
#endif
  }

  return;
}